

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignatureRefining.cpp
# Opt level: O2

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_171::SignatureRefining::run::CodeUpdater::create(CodeUpdater *this)

{
  SignatureRefining *parent;
  Module *wasm;
  CodeUpdater *this_00;
  long in_RSI;
  
  parent = *(SignatureRefining **)(in_RSI + 0x130);
  wasm = *(Module **)(in_RSI + 0x138);
  this_00 = (CodeUpdater *)operator_new(0x140);
  wasm::(anonymous_namespace)::SignatureRefining::run(wasm::Module*)::CodeUpdater::CodeUpdater(wasm
  ::(anonymous_namespace)::SignatureRefining&,wasm::Module__(this_00,parent,wasm);
  (this->super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::Visitor<CodeUpdater,_void>_>_>).
  super_Pass._vptr_Pass = (_func_int **)this_00;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
        return std::make_unique<CodeUpdater>(parent, wasm);
      }